

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O0

int EVP_tls_cbc_record_digest_supported(EVP_MD *md)

{
  int iVar1;
  EVP_MD *md_local;
  
  iVar1 = EVP_MD_type((EVP_MD *)md);
  if ((iVar1 == 0x40) || (iVar1 == 0x2a0)) {
    md_local._4_4_ = 1;
  }
  else {
    md_local._4_4_ = 0;
  }
  return md_local._4_4_;
}

Assistant:

int EVP_tls_cbc_record_digest_supported(const EVP_MD *md) {
  switch (EVP_MD_type(md)) {
    case NID_sha1:
    case NID_sha256:
      return 1;
    default:
      return 0;
  }
}